

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O3

void __thiscall
AnalyserExternalVariable_containsDependencyByName_Test::TestBody
          (AnalyserExternalVariable_containsDependencyByName_Test *this)

{
  shared_ptr *psVar1;
  string sVar2;
  char cVar3;
  byte bVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AnalyserExternalVariablePtr externalVariable;
  ModelPtr model;
  ParserPtr parser;
  long *local_b0 [2];
  long local_a0 [2];
  AssertionResult local_90;
  long local_80 [2];
  string local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Parser::create(SUB81(local_30,0));
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_90);
  libcellml::Parser::parseModel(local_40);
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  local_b0[0] = (long *)0x0;
  local_50 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_90,"size_t(0)","parser->issueCount()",(unsigned_long *)local_b0,
             (unsigned_long *)&local_50);
  if ((string)local_90.success_ == (string)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_90.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_90.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xa9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (local_b0[0] != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_b0[0] != (long *)0x0)) {
        (**(code **)(*local_b0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar2 = local_40[0];
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"membrane","");
  libcellml::ComponentEntity::component(local_60,(bool)sVar2);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"V","");
  libcellml::Component::variable(local_70);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_50);
  if (local_68.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.ptr_);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  psVar1 = local_50;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"membrane","");
  libcellml::ComponentEntity::component(local_60,(bool)local_40[0]);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Cm","");
  libcellml::Component::variable(local_70);
  libcellml::AnalyserExternalVariable::addDependency(psVar1);
  if (local_68.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.ptr_);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  psVar1 = local_50;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"membrane","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Cm","");
  local_70[0] = (string)libcellml::AnalyserExternalVariable::containsDependency
                                  (psVar1,local_40,(string *)&local_90);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  if (local_70[0] == (string)0x0) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)local_70,
               "externalVariable->containsDependency(model, \"membrane\", \"Cm\")","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xaf,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if ((long *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80[0] + 1);
    }
    if (local_b0[0] != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_b0[0] != (long *)0x0)) {
        (**(code **)(*local_b0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_50;
  local_90._0_8_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"membrane","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"X","");
  bVar4 = libcellml::AnalyserExternalVariable::containsDependency
                    (psVar1,local_40,(string *)&local_90);
  local_70[0] = (string)(bVar4 ^ 1);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if ((long *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_,local_80[0] + 1);
  }
  if (local_70[0] == (string)0x0) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(char *)local_70,
               "externalVariable->containsDependency(model, \"membrane\", \"X\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xb0,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if ((long *)local_90._0_8_ != local_80) {
      operator_delete((void *)local_90._0_8_,local_80[0] + 1);
    }
    if (local_b0[0] != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_b0[0] != (long *)0x0)) {
        (**(code **)(*local_b0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(AnalyserExternalVariable, containsDependencyByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    externalVariable->addDependency(model->component("membrane")->variable("Cm"));

    EXPECT_TRUE(externalVariable->containsDependency(model, "membrane", "Cm"));
    EXPECT_FALSE(externalVariable->containsDependency(model, "membrane", "X"));
}